

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

ptls_t * ptls_client_new(ptls_context_t *ctx)

{
  ptls_t *ppVar1;
  uint8_t *puVar2;
  
  ppVar1 = new_instance(ctx,0);
  ppVar1->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
  (*ppVar1->ctx->random_bytes)(ppVar1->client_random,0x20);
  if ((ppVar1->field_0x160 & 4) != 0) {
    puVar2 = (uint8_t *)((long)&ppVar1->field_18 + 0x10);
    (ppVar1->field_18).client.legacy_session_id.base = puVar2;
    (ppVar1->field_18).client.legacy_session_id.len = 0x20;
    (*ppVar1->ctx->random_bytes)(puVar2,0x20);
  }
  return ppVar1;
}

Assistant:

ptls_t *ptls_client_new(ptls_context_t *ctx)
{
    ptls_t *tls = new_instance(ctx, 0);
    tls->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
    tls->ctx->random_bytes(tls->client_random, sizeof(tls->client_random));
    log_client_random(tls);
    if (tls->send_change_cipher_spec) {
        tls->client.legacy_session_id =
            ptls_iovec_init(tls->client.legacy_session_id_buf, sizeof(tls->client.legacy_session_id_buf));
        tls->ctx->random_bytes(tls->client.legacy_session_id.base, tls->client.legacy_session_id.len);
    }

    PTLS_PROBE(NEW, tls, 0);
    return tls;
}